

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
write_double_value(basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *this
                  ,double val,ser_context *context,string_type *str,error_code *ec)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  const_pointer pvVar4;
  char *in_RDX;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  error_code *unaff_retaddr;
  ser_context *in_stack_00000008;
  semantic_tag in_stack_00000017;
  string_view_type *in_stack_00000018;
  basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000150;
  double in_stack_00000158;
  write_double *in_stack_00000160;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  undefined1 local_98 [16];
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  undefined1 local_68 [16];
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined1 local_38 [16];
  char *local_20;
  double local_10;
  
  local_20 = in_RDX;
  local_10 = in_XMM0_Qa;
  bVar1 = std::isfinite(in_XMM0_Qa);
  if (bVar1) {
    jsoncons::detail::write_double::operator()
              (in_stack_00000160,in_stack_00000158,in_stack_00000150);
  }
  else {
    uVar2 = std::isnan(local_10);
    if ((uVar2 & 1) == 0) {
      dVar5 = std::numeric_limits<double>::infinity();
      if ((local_10 != dVar5) || (NAN(local_10) || NAN(dVar5))) {
        if ((*(byte *)(in_RDI + 0x118) & 1) == 0) {
          if ((*(byte *)(in_RDI + 0x140) & 1) == 0) {
            local_a8 = null_constant();
            pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_a8);
            local_b8 = null_constant();
            std::basic_string_view<char,_std::char_traits<char>_>::size(&local_b8);
            std::__cxx11::string::append(local_20,(ulong)pvVar4);
          }
          else {
            local_98 = std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)(in_RDI + 0x148));
            visit_string(in_stack_00000020,in_stack_00000018,in_stack_00000017,in_stack_00000008,
                         unaff_retaddr);
          }
        }
        else {
          uVar3 = std::__cxx11::string::data();
          std::__cxx11::string::length();
          std::__cxx11::string::append(local_20,uVar3);
        }
      }
      else if ((*(byte *)(in_RDI + 200) & 1) == 0) {
        if ((*(byte *)(in_RDI + 0xf0) & 1) == 0) {
          local_78 = null_constant();
          pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_78);
          local_88 = null_constant();
          std::basic_string_view<char,_std::char_traits<char>_>::size(&local_88);
          std::__cxx11::string::append(local_20,(ulong)pvVar4);
        }
        else {
          local_68 = std::__cxx11::string::operator_cast_to_basic_string_view
                               ((string *)(in_RDI + 0xf8));
          visit_string(in_stack_00000020,in_stack_00000018,in_stack_00000017,in_stack_00000008,
                       unaff_retaddr);
        }
      }
      else {
        uVar3 = std::__cxx11::string::data();
        std::__cxx11::string::length();
        std::__cxx11::string::append(local_20,uVar3);
      }
    }
    else if ((*(byte *)(in_RDI + 0x7b) & 1) == 0) {
      if ((*(byte *)(in_RDI + 0xa0) & 1) == 0) {
        local_48 = null_constant();
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_48);
        local_58 = null_constant();
        std::basic_string_view<char,_std::char_traits<char>_>::size(&local_58);
        std::__cxx11::string::append(local_20,(ulong)pvVar4);
      }
      else {
        local_38 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)(in_RDI + 0xa8));
        visit_string(in_stack_00000020,in_stack_00000018,in_stack_00000017,in_stack_00000008,
                     unaff_retaddr);
      }
    }
    else {
      uVar3 = std::__cxx11::string::data();
      std::__cxx11::string::length();
      std::__cxx11::string::append(local_20,uVar3);
    }
  }
  return;
}

Assistant:

void write_double_value(double val, const ser_context& context, string_type& str, std::error_code& ec)
    {
        if (!std::isfinite(val))
        {
            if ((std::isnan)(val))
            {
                if (enable_nan_to_num_)
                {
                    str.append(nan_to_num_.data(), nan_to_num_.length());
                }
                else if (enable_nan_to_str_)
                {
                    visit_string(nan_to_str_, semantic_tag::none, context, ec);
                }
                else
                {
                    str.append(null_constant().data(), null_constant().size());
                }
            }
            else if (val == std::numeric_limits<double>::infinity())
            {
                if (enable_inf_to_num_)
                {
                    str.append(inf_to_num_.data(), inf_to_num_.length());
                }
                else if (enable_inf_to_str_)
                {
                    visit_string(inf_to_str_, semantic_tag::none, context, ec);
                }
                else
                {
                    str.append(null_constant().data(), null_constant().size());
                }
            }
            else
            {
                if (enable_neginf_to_num_)
                {
                    str.append(neginf_to_num_.data(), neginf_to_num_.length());
                }
                else if (enable_neginf_to_str_)
                {
                    visit_string(neginf_to_str_, semantic_tag::none, context, ec);
                }
                else
                {
                    str.append(null_constant().data(), null_constant().size());
                }
            }
        }
        else
        {
            fp_(val, str);
        }
    }